

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void trace2(Abc_Obj_t *pObj)

{
  undefined1 *puVar1;
  uint uVar2;
  Abc_Ntk_t **ppAVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  
  do {
    print_node(pObj);
    uVar2 = (pObj->vFanins).nSize;
    if ((int)uVar2 < 1) {
      return;
    }
    ppAVar3 = &pObj->pNtk;
    pVVar4 = &pObj->vFanins;
    puVar1 = &pObj->field_0x14;
    uVar5 = 0;
    while (pObj = (Abc_Obj_t *)(*ppAVar3)->vObjs->pArray[pVVar4->pArray[uVar5]],
          (int)(*(uint *)&pObj->field_0x14 >> 0xc) < (int)((*(uint *)puVar1 >> 0xc) - 1)) {
      uVar5 = uVar5 + 1;
      if (uVar2 == uVar5) {
        return;
      }
    }
  } while( true );
}

Assistant:

void trace2(Abc_Obj_t *pObj) {
  Abc_Obj_t *pNext;
  int i;

  print_node(pObj);
  Abc_ObjForEachFanin(pObj, pNext, i) 
    if (pNext->Level >= pObj->Level - 1) {
      trace2(pNext);
      break;
    }
}